

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
tinyusdz::GeomMesh::get_faceVertexIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeomMesh *this,double time)

{
  bool bVar1;
  value_type *this_00;
  vector<int,_std::allocator<int>_> val;
  optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> pv;
  _Vector_base<int,_std::allocator<int>_> local_78;
  optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::authored
                    (&this->faceVertexIndices);
  if (((bVar1) && ((this->faceVertexIndices)._blocked == false)) &&
     (((this->faceVertexIndices)._paths.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (this->faceVertexIndices)._paths.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start ||
      (((this->faceVertexIndices)._attrib.has_value_ & 1U) != 0)))) {
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
    ::optional(&local_60,&(this->faceVertexIndices)._attrib);
    if (local_60.has_value_ == true) {
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value
                          (&local_60);
      bVar1 = Animatable<std::vector<int,_std::allocator<int>_>_>::get
                        (this_00,time,(vector<int,_std::allocator<int>_> *)&local_78,Held);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::_M_move_assign(__return_storage_ptr__,&local_78);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
    ::~optional(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> GeomMesh::get_faceVertexIndices(double time) const {
  std::vector<int32_t> dst;

  if (!faceVertexIndices.authored() || faceVertexIndices.is_blocked()) {
    return dst;
  }

  if (faceVertexIndices.is_connection()) {
    // TODO: connection
    return dst;
  }

  if (auto pv = faceVertexIndices.get_value()) {
    std::vector<int32_t> val;
    if (pv.value().get(time, &val, value::TimeSampleInterpolationType::Held)) {
      dst = std::move(val);
    }
  }
  return dst;
}